

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphIO.cpp
# Opt level: O0

ErrorCode Escape::loadGraph(char *path,Graph *graph,int undirected,IOFormat fmt)

{
  IOFormat fmt_local;
  int undirected_local;
  Graph *graph_local;
  char *path_local;
  
  if (fmt == escape) {
    path_local._4_4_ = loadGraph_Escape(path,graph,undirected);
  }
  else {
    path_local._4_4_ = ecUnsupportedFormat;
  }
  return path_local._4_4_;
}

Assistant:

ErrorCode Escape::loadGraph(const char *path, Graph &graph, int undirected, IOFormat fmt) {
    switch (fmt) {
        case IOFormat::escape:
            return loadGraph_Escape(path, graph, undirected);
        default:
            return ecUnsupportedFormat;
    }
}